

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamToolsIndex_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamToolsIndex::Load(BamToolsIndex *this,string *filename)

{
  BamException *e;
  BamToolsIndex *in_stack_00000050;
  OpenMode in_stack_000000f4;
  string *in_stack_000000f8;
  BamToolsIndex *in_stack_00000100;
  BamToolsIndex *in_stack_ffffffffffffffe0;
  
  OpenFile(in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
  LoadHeader(in_stack_00000050);
  LoadFileSummary(in_stack_ffffffffffffffe0);
  return true;
}

Assistant:

bool BamToolsIndex::Load(const std::string& filename)
{

    try {

        // attempt to open file (read-only)
        OpenFile(filename, IBamIODevice::ReadOnly);

        // load metadata & generate in-memory summary
        LoadHeader();
        LoadFileSummary();

        // return success
        return true;

    } catch (BamException& e) {
        m_errorString = e.what();
        return false;
    }
}